

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_filter_header(any *context,HTTPRequest *req,string *strURIPart)

{
  long lVar1;
  string str;
  UniValue val;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  pointer puVar2;
  pointer ppCVar3;
  bool bVar4;
  char cVar5;
  RESTResponseFormat RVar6;
  long lVar7;
  _Storage<unsigned_long,_true> __n;
  BlockFilterIndex *this;
  ChainstateManager *this_00;
  Chainstate *pCVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *__s;
  string *this_01;
  string *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer ppCVar10;
  uint256 *header;
  base_blob<256U> *pbVar11;
  base_blob<256u> *this_03;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string_view str_00;
  string_view str_01;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  string_view str_02;
  optional<unsigned_long> oVar12;
  undefined7 uStack_358;
  BlockFilterType in_stack_fffffffffffffcaf;
  undefined4 uStack_34c;
  vector<uint256,_std::allocator<uint256>_> filter_headers;
  undefined8 uStack_330;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> headers;
  undefined8 uStack_310;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  UniValue local_2d0;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  string local_200;
  undefined1 local_1e0 [32];
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  optional<uint256> block_hash;
  string local_118;
  string local_f8 [2];
  CBlockIndex *pindex;
  __extent_storage<18446744073709551615UL> local_b0;
  string raw_blockhash;
  string raw_count;
  string param;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CheckWarmup(req);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_0025c6e7;
  }
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  param.field_2._M_local_buf[0] = '\0';
  RVar6 = ParseDataFormat(&param,strURIPart);
  str_00._M_str = (char *)0x2f;
  str_00._M_len = (size_t)param._M_dataplus._M_p;
  util::SplitString_abi_cxx11_(&uri_parts,(util *)param._M_string_length,str_00,(char)in_R8);
  raw_count._M_dataplus._M_p = (pointer)&raw_count.field_2;
  raw_count._M_string_length = 0;
  paVar9 = &raw_blockhash.field_2;
  raw_blockhash._M_string_length = 0;
  raw_count.field_2._M_local_buf[0] = '\0';
  raw_blockhash.field_2._M_local_buf[0] = '\0';
  lVar7 = (long)uri_parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)uri_parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  raw_blockhash._M_dataplus._M_p = (pointer)paVar9;
  if (lVar7 == 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&raw_blockhash,
               uri_parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pindex,"count",(allocator<char> *)local_1e0);
    HTTPRequest::GetQueryParameter
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&criticalblock9,req,(string *)&pindex);
    std::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_hash,
               (optional<std::__cxx11::string> *)&criticalblock9,(char (*) [2])0x865684);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&raw_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_hash);
    std::__cxx11::string::~string((string *)&block_hash);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&criticalblock9);
    std::__cxx11::string::~string((string *)&pindex);
LAB_0025c388:
    str_02._M_str = raw_count._M_dataplus._M_p;
    str_02._M_len = raw_count._M_string_length;
    oVar12 = ToIntegral<unsigned_long>(str_02);
    __n._M_value = oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
    if ((oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged & __n._M_value - 1 < 2000) == 0) {
      tinyformat::format<unsigned_int,std::__cxx11::string>
                (&local_118,
                 (tinyformat *)"Header count is invalid or out of acceptable range (1-%u): %s",
                 (char *)&MAX_REST_HEADERS_RESULTS,(uint *)&raw_count,in_R8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_118);
      this_01 = &local_118;
      goto LAB_0025c6af;
    }
    str_01._M_str = (char *)paVar9;
    str_01._M_len = (size_t)raw_blockhash._M_dataplus._M_p;
    detail::FromHex<uint256>(&block_hash,(detail *)raw_blockhash._M_string_length,str_01);
    if (block_hash.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == false) {
      std::operator+(&local_160,"Invalid hash: ",&raw_blockhash);
      RESTERR(req,HTTP_BAD_REQUEST,&local_160);
      this_01 = &local_160;
      goto LAB_0025c6af;
    }
    bVar4 = BlockFilterTypeByName
                      (uri_parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&filtertype);
    if (!bVar4) {
      std::operator+(&local_180,"Unknown filtertype ",
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      RESTERR(req,HTTP_BAD_REQUEST,&local_180);
      this_01 = &local_180;
      goto LAB_0025c6af;
    }
    this = GetBlockFilterIndex(in_stack_fffffffffffffcaf);
    if (this == (BlockFilterIndex *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1e0 + 0x40),"Index is not enabled for filtertype ",
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      RESTERR(req,HTTP_BAD_REQUEST,(string *)(local_1e0 + 0x40));
      this_01 = (string *)(local_1e0 + 0x40);
      goto LAB_0025c6af;
    }
    headers.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    headers.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    headers.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::reserve
              (&headers,__n._M_value);
    this_00 = GetChainman(context,req);
    if (this_00 == (ChainstateManager *)0x0) {
      bVar4 = false;
    }
    else {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock9,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                 ,0x1a0,false);
      pCVar8 = ChainstateManager::ActiveChainstate(this_00);
      pindex = node::BlockManager::LookupBlockIndex(&this_00->m_blockman,(uint256 *)&block_hash);
      for (; pindex != (CBlockIndex *)0x0; pindex = CChain::Next(&pCVar8->m_chain,pindex)) {
        bVar4 = CChain::Contains(&pCVar8->m_chain,pindex);
        if (!bVar4) break;
        std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                  (&headers,&pindex);
        if ((long)headers.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)headers.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 == __n._M_value) break;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
      cVar5 = BaseIndex::BlockUntilSyncedToCurrentChain(&this->super_BaseIndex);
      filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::reserve(&filter_headers,__n._M_value);
      ppCVar3 = headers.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar10 = headers.
                      super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          puVar2 = filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish, ppCVar10 != ppCVar3; ppCVar10 = ppCVar10 + 1)
      {
        criticalblock9.super_unique_lock._M_device = (mutex_type *)0x0;
        criticalblock9.super_unique_lock._M_owns = false;
        criticalblock9.super_unique_lock._9_7_ = 0;
        bVar4 = BlockFilterIndex::LookupFilterHeader(this,*ppCVar10,(value_type *)&criticalblock9);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pindex,"Filter not found.",(allocator<char> *)local_1e0);
          __s = " Block filters are still in the process of being indexed.";
          if (cVar5 != '\0') {
            __s = " This error is unexpected and indicates index corruption.";
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pindex,
                     __s);
          std::__cxx11::string::string
                    ((string *)(local_1e0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pindex);
          RESTERR(req,HTTP_NOT_FOUND,(string *)(local_1e0 + 0x20));
          this_02 = (string *)(local_1e0 + 0x20);
          goto LAB_0025c919;
        }
        std::vector<uint256,_std::allocator<uint256>_>::push_back
                  (&filter_headers,(value_type *)&criticalblock9);
      }
      if (RVar6 == JSON) {
        local_278 = local_268;
        local_270 = 0;
        local_268[0] = 0;
        str._M_dataplus._M_p._7_1_ = cVar5;
        str._M_dataplus._M_p._0_7_ = uStack_358;
        str._M_string_length._0_4_ = 3;
        str._M_string_length._4_4_ = uStack_34c;
        str.field_2._M_allocated_capacity =
             (size_type)
             filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
        str.field_2._8_8_ =
             filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish;
        UniValue::UniValue((UniValue *)&criticalblock9,VARR,str);
        std::__cxx11::string::~string((string *)&local_278);
        puVar2 = filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (this_03 = (base_blob<256u> *)
                       filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start; this_03 != (base_blob<256u> *)puVar2;
            this_03 = this_03 + 0x20) {
          base_blob<256u>::GetHex_abi_cxx11_((string *)&pindex,this_03);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_2d0,(string *)&pindex);
          val._7_1_ = cVar5;
          val._0_7_ = uStack_358;
          val.val._M_dataplus._M_p._0_4_ = 3;
          val.val._M_dataplus._M_p._4_4_ = uStack_34c;
          val.val._M_string_length =
               (size_type)
               filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
          val.val.field_2._M_allocated_capacity =
               (size_type)
               filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish;
          val.val.field_2._8_8_ =
               filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_330;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)headers.
                        super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)headers.
                        super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)headers.
                        super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)uStack_310;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)uri_parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          UniValue::push_back((UniValue *)&criticalblock9,val);
          UniValue::~UniValue(&local_2d0);
          std::__cxx11::string::~string((string *)&pindex);
        }
        UniValue::write_abi_cxx11_((UniValue *)local_1e0,(int)&criticalblock9,(void *)0x0,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pindex,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,"\n");
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e0,"Content-Type",(allocator<char> *)((long)&uStack_34c + 3));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"application/json",
                   (allocator<char> *)((long)&uStack_34c + 2));
        HTTPRequest::WriteHeader(req,(string *)local_1e0,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)local_1e0);
        reply_00._M_extent._M_extent_value = local_b0._M_extent_value;
        reply_00._M_ptr = (pointer)pindex;
        HTTPRequest::WriteReply(req,200,reply_00);
        std::__cxx11::string::~string((string *)&pindex);
        UniValue::~UniValue((UniValue *)&criticalblock9);
LAB_0025cb94:
        bVar4 = true;
      }
      else {
        if (RVar6 == HEX) {
          criticalblock9.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock9.super_unique_lock._M_owns = false;
          criticalblock9.super_unique_lock._9_7_ = 0;
          for (pbVar11 = &(filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>;
              pbVar11 != &puVar2->super_base_blob<256U>; pbVar11 = pbVar11 + 1) {
            base_blob<256U>::Serialize<DataStream>(pbVar11,(DataStream *)&criticalblock9);
          }
          s.m_size = criticalblock9.super_unique_lock._8_8_ -
                     (long)criticalblock9.super_unique_lock._M_device;
          s.m_data = (uchar *)criticalblock9.super_unique_lock._M_device;
          HexStr_abi_cxx11_((string *)local_1e0,s);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pindex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e0,"\n");
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e0,"Content-Type",(allocator<char> *)((long)&uStack_34c + 3));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"text/plain",(allocator<char> *)((long)&uStack_34c + 2));
          HTTPRequest::WriteHeader(req,(string *)local_1e0,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)local_1e0);
          reply._M_extent._M_extent_value = local_b0._M_extent_value;
          reply._M_ptr = (pointer)pindex;
          HTTPRequest::WriteReply(req,200,reply);
          std::__cxx11::string::~string((string *)&pindex);
LAB_0025caa5:
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                     &criticalblock9);
          goto LAB_0025cb94;
        }
        if (RVar6 == BINARY) {
          criticalblock9.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock9.super_unique_lock._M_owns = false;
          criticalblock9.super_unique_lock._9_7_ = 0;
          for (pbVar11 = &(filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>;
              pbVar11 != &puVar2->super_base_blob<256U>; pbVar11 = pbVar11 + 1) {
            base_blob<256U>::Serialize<DataStream>(pbVar11,(DataStream *)&criticalblock9);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pindex,"Content-Type",(allocator<char> *)&local_200);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e0,"application/octet-stream",
                     (allocator<char> *)((long)&uStack_34c + 3));
          HTTPRequest::WriteHeader(req,(string *)&pindex,(string *)local_1e0);
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::~string((string *)&pindex);
          reply_01._M_extent._M_extent_value =
               criticalblock9.super_unique_lock._8_8_ -
               (long)criticalblock9.super_unique_lock._M_device;
          reply_01._M_ptr = (pointer)criticalblock9.super_unique_lock._M_device;
          HTTPRequest::WriteReply(req,200,reply_01);
          goto LAB_0025caa5;
        }
        AvailableDataFormatsString_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock9,"output format not found (available: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pindex)
        ;
        std::operator+(&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock9,")");
        RESTERR(req,HTTP_NOT_FOUND,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        this_02 = (string *)&criticalblock9;
LAB_0025c919:
        std::__cxx11::string::~string(this_02);
        std::__cxx11::string::~string((string *)&pindex);
        bVar4 = false;
      }
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&filter_headers.super__Vector_base<uint256,_std::allocator<uint256>_>);
    }
    std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
              (&headers.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>);
  }
  else {
    if (lVar7 == 3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&raw_blockhash,
                 uri_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&raw_count,
                 uri_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      goto LAB_0025c388;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,
               "Invalid URI format. Expected /rest/blockfilterheaders/<filtertype>/<blockhash>.<ext>?count=<count>"
               ,(allocator<char> *)&criticalblock9);
    RESTERR(req,HTTP_BAD_REQUEST,local_f8);
    this_01 = local_f8;
LAB_0025c6af:
    std::__cxx11::string::~string((string *)this_01);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&raw_blockhash);
  std::__cxx11::string::~string((string *)&raw_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&uri_parts);
  std::__cxx11::string::~string((string *)&param);
LAB_0025c6e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_filter_header(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uri_parts = SplitString(param, '/');
    std::string raw_count;
    std::string raw_blockhash;
    if (uri_parts.size() == 3) {
        // deprecated path: /rest/blockfilterheaders/<filtertype>/<count>/<blockhash>
        raw_blockhash = uri_parts[2];
        raw_count = uri_parts[1];
    } else if (uri_parts.size() == 2) {
        // new path with query parameter: /rest/blockfilterheaders/<filtertype>/<blockhash>?count=<count>
        raw_blockhash = uri_parts[1];
        try {
            raw_count = req->GetQueryParameter("count").value_or("5");
        } catch (const std::runtime_error& e) {
            return RESTERR(req, HTTP_BAD_REQUEST, e.what());
        }
    } else {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilterheaders/<filtertype>/<blockhash>.<ext>?count=<count>");
    }

    const auto parsed_count{ToIntegral<size_t>(raw_count)};
    if (!parsed_count.has_value() || *parsed_count < 1 || *parsed_count > MAX_REST_HEADERS_RESULTS) {
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Header count is invalid or out of acceptable range (1-%u): %s", MAX_REST_HEADERS_RESULTS, raw_count));
    }

    auto block_hash{uint256::FromHex(raw_blockhash)};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + raw_blockhash);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    std::vector<const CBlockIndex*> headers;
    headers.reserve(*parsed_count);
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        CChain& active_chain = chainman.ActiveChain();
        const CBlockIndex* pindex{chainman.m_blockman.LookupBlockIndex(*block_hash)};
        while (pindex != nullptr && active_chain.Contains(pindex)) {
            headers.push_back(pindex);
            if (headers.size() == *parsed_count)
                break;
            pindex = active_chain.Next(pindex);
        }
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    std::vector<uint256> filter_headers;
    filter_headers.reserve(*parsed_count);
    for (const CBlockIndex* pindex : headers) {
        uint256 filter_header;
        if (!index->LookupFilterHeader(pindex, filter_header)) {
            std::string errmsg = "Filter not found.";

            if (!index_ready) {
                errmsg += " Block filters are still in the process of being indexed.";
            } else {
                errmsg += " This error is unexpected and indicates index corruption.";
            }

            return RESTERR(req, HTTP_NOT_FOUND, errmsg);
        }
        filter_headers.push_back(filter_header);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssHeader);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        std::string strHex = HexStr(ssHeader) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue jsonHeaders(UniValue::VARR);
        for (const uint256& header : filter_headers) {
            jsonHeaders.push_back(header.GetHex());
        }

        std::string strJSON = jsonHeaders.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}